

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O2

double ExprEval::Operator::trigger(size_t index,double *args)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  double dVar4;
  
  dVar4 = 0.0;
  switch(index) {
  case 0:
    dVar4 = *args + args[1];
    break;
  case 1:
    dVar4 = *args - args[1];
    break;
  case 2:
    dVar4 = *args * args[1];
    break;
  case 3:
    dVar4 = *args / args[1];
    break;
  case 4:
    dVar4 = pow(*args,args[1]);
    return dVar4;
  case 5:
    dVar4 = _mod(args,(size_t)args);
    return dVar4;
  case 6:
    dVar4 = log(*args);
    return dVar4;
  case 7:
    dVar4 = log2(*args);
    return dVar4;
  case 8:
    dVar4 = log10(*args);
    return dVar4;
  case 9:
    dVar4 = sin(*args);
    return dVar4;
  case 10:
    dVar4 = cos(*args);
    return dVar4;
  case 0xb:
    dVar4 = tan(*args);
    return dVar4;
  case 0xc:
    dVar4 = cos(*args);
    dVar1 = sin(*args);
    dVar4 = dVar4 / dVar1;
    break;
  case 0xd:
    dVar4 = sinh(*args);
    return dVar4;
  case 0xe:
    dVar4 = cosh(*args);
    return dVar4;
  case 0xf:
    dVar4 = tanh(*args);
    return dVar4;
  case 0x10:
    dVar4 = asin(*args);
    return dVar4;
  case 0x11:
    dVar4 = acos(*args);
    return dVar4;
  case 0x12:
    dVar4 = atan(*args);
    return dVar4;
  case 0x13:
    dVar4 = asinh(*args);
    return dVar4;
  case 0x14:
    dVar4 = acosh(*args);
    return dVar4;
  case 0x15:
    dVar4 = atanh(*args);
    return dVar4;
  case 0x16:
    dVar4 = round(*args);
    return dVar4;
  case 0x17:
    dVar4 = floor(*args);
    return dVar4;
  case 0x18:
    dVar4 = ceil(*args);
    return dVar4;
  case 0x19:
    dVar4 = ABS(*args);
    break;
  case 0x1a:
    dVar4 = tgamma(*args);
    return dVar4;
  case 0x1b:
    iVar3 = rand();
    dVar4 = (double)iVar3 / 2147483647.0;
    break;
  case 0x1c:
    dVar4 = 3.141592653589793;
    break;
  case 0x1d:
    dVar4 = 2.718281828459045;
    break;
  case 0x1e:
    return 1.0;
  case 0x20:
    uVar2 = (int)args[1] & (int)*args;
    goto LAB_0010e6c8;
  case 0x21:
    uVar2 = (int)args[1] | (int)*args;
    goto LAB_0010e6c8;
  case 0x22:
    if ((int)*args == 0) {
      return 1.0;
    }
    return 0.0;
  case 0x23:
    uVar2 = (int)args[1] ^ (int)*args;
    goto LAB_0010e6c8;
  case 0x24:
    uVar2 = (int)*args << ((byte)(int)args[1] & 0x1f);
    goto LAB_0010e6c8;
  case 0x25:
    uVar2 = (int)*args >> ((byte)(int)args[1] & 0x1f);
LAB_0010e6c8:
    dVar4 = (double)(int)uVar2;
  }
  return dVar4;
}

Assistant:

double trigger(size_t index, double* args){
            double result = 0.0;

            if(index == 0){
                return _add(args);
            } else if(index == 1){
                return _subtract(args);
            } else if(index == 2){
                return _multiply(args);
            } else if(index == 3){
                return _divide(args);
            } else if(index == 4){
                return _pow(args);
            } else if(index == 5){
                return _mod(args);
            } else if(index == 6){
                return _ln(args);
            } else if(index == 7){
                return _log2(args);
            } else if(index == 8){
                return _log10(args);
            } else if(index == 9){
                return _sin(args);
            } else if(index == 10){
                return _cos(args);
            } else if(index == 11){
                return _tan(args);
            } else if(index == 12){
                return _cot(args);
            } else if(index == 13){
                return _sinh(args);
            } else if(index == 14){
                return _cosh(args);
            } else if(index == 15){
                return _tanh(args);
            } else if(index == 16){
                return _arcsin(args);
            } else if(index == 17){
                return _arccos(args);
            } else if(index == 18){
                return _arctan(args);
            } else if(index == 19){
                return _arcsinh(args);
            } else if(index == 20){
                return _arccosh(args);
            } else if(index == 21){
                return _arctanh(args);
            } else if(index == 22){
                return _round(args);
            } else if(index == 23){
                return _floor(args);
            } else if(index == 24){
                return _ceil(args);
            } else if(index == 25){
                return _abs(args);
            } else if(index == 26){
                return _gamma(args);
            } else if(index == 27){
                return _rand(args);
            } else if(index == 28){ // Adding a constant
                return _pi(args);
            } else if(index == 29){ // Adding a constant
                return _e(args);
            } else if(index == 30){ // Adding a constant
                return _true(args);
            } else if(index == 31){ // Adding a constant
                return _false(args);
            } else if(index == 32){
                return _and(args);
            } else if(index == 33){
                return _or(args);
            } else if(index == 34){
                return _not(args);
            } else if(index == 35){
                return _xor(args);
            } else if(index == 36){
                return _shiftl(args);
            } else if(index == 37){
                return _shiftr(args);
            }

            return result;
        }